

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_header_gen.c
# Opt level: O0

void codePTL(H265eStream *s,H265ePTL *ptl,RK_U32 profilePresentFlag,int maxNumSubLayersMinus1)

{
  int local_24;
  RK_S32 i;
  int maxNumSubLayersMinus1_local;
  RK_U32 profilePresentFlag_local;
  H265ePTL *ptl_local;
  H265eStream *s_local;
  
  if (profilePresentFlag != 0) {
    codeProfileTier(s,&ptl->m_generalPTL);
  }
  h265e_stream_write_with_log(s,(ptl->m_generalPTL).m_levelIdc,8,"general_level_idc");
  for (local_24 = 0; local_24 < maxNumSubLayersMinus1; local_24 = local_24 + 1) {
    if (profilePresentFlag != 0) {
      h265e_stream_write1_with_log
                (s,ptl->m_subLayerProfilePresentFlag[local_24],"sub_layer_profile_present_flag[i]");
    }
    h265e_stream_write1_with_log
              (s,ptl->m_subLayerLevelPresentFlag[local_24],"sub_layer_level_present_flag[i]");
  }
  local_24 = maxNumSubLayersMinus1;
  if (0 < maxNumSubLayersMinus1) {
    for (; local_24 < 8; local_24 = local_24 + 1) {
      h265e_stream_write_with_log(s,0,2,"reserved_zero_2bits");
    }
  }
  for (local_24 = 0; local_24 < maxNumSubLayersMinus1; local_24 = local_24 + 1) {
    if ((profilePresentFlag != 0) && (ptl->m_subLayerProfilePresentFlag[local_24] != 0)) {
      codeProfileTier(s,ptl->m_subLayerPTL + local_24);
    }
    if (ptl->m_subLayerLevelPresentFlag[local_24] != 0) {
      h265e_stream_write_with_log
                (s,ptl->m_subLayerPTL[local_24].m_levelIdc,8,"sub_layer_level_idc[i]");
    }
  }
  return;
}

Assistant:

void codePTL(H265eStream *s, H265ePTL* ptl, RK_U32 profilePresentFlag, int maxNumSubLayersMinus1)
{
    RK_S32 i;
    if (profilePresentFlag) {
        codeProfileTier(s, &ptl->m_generalPTL);
    }
    h265e_stream_write_with_log(s, ptl->m_generalPTL.m_levelIdc, 8, "general_level_idc");

    for (i = 0; i < maxNumSubLayersMinus1; i++) {
        if (profilePresentFlag) {
            h265e_stream_write1_with_log(s, ptl->m_subLayerProfilePresentFlag[i], "sub_layer_profile_present_flag[i]");
        }

        h265e_stream_write1_with_log(s, ptl->m_subLayerLevelPresentFlag[i], "sub_layer_level_present_flag[i]");
    }

    if (maxNumSubLayersMinus1 > 0) {
        for (i = maxNumSubLayersMinus1; i < 8; i++) {
            h265e_stream_write_with_log(s, 0, 2, "reserved_zero_2bits");
        }
    }

    for (i = 0; i < maxNumSubLayersMinus1; i++) {
        if (profilePresentFlag && ptl->m_subLayerProfilePresentFlag[i]) {
            codeProfileTier(s, &ptl->m_subLayerPTL[i]); // sub_layer_...
        }
        if (ptl->m_subLayerLevelPresentFlag[i]) {
            h265e_stream_write_with_log(s, ptl->m_subLayerPTL[i].m_levelIdc, 8, "sub_layer_level_idc[i]");
        }
    }
}